

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_copy_logical_type
          (CompilerGLSL *this,uint32_t lhs_id,uint32_t lhs_type_id,uint32_t rhs_id,
          uint32_t rhs_type_id,SmallVector<unsigned_int,_8UL> *chain)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar2;
  size_t sVar3;
  uint32_t uVar4;
  SPIRType *type;
  SPIRExpression *pSVar5;
  uint uVar6;
  uint32_t uVar7;
  ulong uVar8;
  __hashtable *__h;
  __hashtable *__h_1;
  __node_gen_type __node_gen;
  AccessChainMeta rhs_meta;
  AccessChainMeta lhs_meta;
  string rhs;
  string lhs;
  uint32_t local_140;
  uint32_t local_13c;
  uint32_t local_138;
  uint32_t local_134;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_130;
  ulong local_128;
  CompilerGLSL *local_120;
  uint32_t local_118;
  uint32_t local_114;
  SPIRType *local_110;
  SPIRType *local_108;
  AccessChainMeta local_100;
  AccessChainMeta local_f0;
  SmallVector<unsigned_int,_8UL> local_e0;
  SmallVector<unsigned_int,_8UL> local_a8;
  string local_70;
  string local_50;
  
  local_140 = rhs_id;
  local_13c = lhs_id;
  local_138 = lhs_id;
  local_134 = rhs_id;
  local_118 = rhs_type_id;
  local_114 = lhs_type_id;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    lhs_type_id);
  local_108 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         rhs_type_id);
  sVar3 = (type->array).super_VectorView<unsigned_int>.buffer_size;
  local_120 = this;
  local_110 = type;
  if (sVar3 == 0) {
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      SmallVector<unsigned_int,_8UL>::reserve
                (chain,(chain->super_VectorView<unsigned_int>).buffer_size + 1);
      sVar3 = (chain->super_VectorView<unsigned_int>).buffer_size;
      (chain->super_VectorView<unsigned_int>).ptr[sVar3] = 0;
      (chain->super_VectorView<unsigned_int>).buffer_size = sVar3 + 1;
      local_128 = (ulong)(uint)(type->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size;
      if (local_128 != 0) {
        uVar8 = 0;
        do {
          (chain->super_VectorView<unsigned_int>).ptr
          [(chain->super_VectorView<unsigned_int>).buffer_size - 1] = (uint)uVar8;
          uVar4 = (type->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar8].id;
          uVar7 = (local_108->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar8].id;
          local_e0.super_VectorView<unsigned_int>.buffer_size = 0;
          local_e0.buffer_capacity = 8;
          local_e0.super_VectorView<unsigned_int>.ptr = (uint *)&local_e0.stack_storage;
          SmallVector<unsigned_int,_8UL>::operator=(&local_e0,chain);
          emit_copy_logical_type(local_120,local_138,uVar4,local_134,uVar7,&local_e0);
          local_e0.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)local_e0.super_VectorView<unsigned_int>.ptr !=
              &local_e0.stack_storage) {
            free(local_e0.super_VectorView<unsigned_int>.ptr);
          }
          uVar8 = uVar8 + 1;
          type = local_110;
        } while (local_128 != uVar8);
      }
    }
    else {
      local_f0.relaxed_precision = false;
      local_f0.access_meshlet_position_y = false;
      local_f0.storage_physical_type = 0;
      local_f0.need_transpose = false;
      local_f0.storage_is_packed = false;
      local_f0.storage_is_invariant = false;
      local_f0.flattened_struct = false;
      local_100.relaxed_precision = false;
      local_100.access_meshlet_position_y = false;
      local_100.storage_physical_type = 0;
      local_100.need_transpose = false;
      local_100.storage_is_packed = false;
      local_100.storage_is_invariant = false;
      local_100.flattened_struct = false;
      access_chain_internal_abi_cxx11_
                (&local_50,this,local_138,(chain->super_VectorView<unsigned_int>).ptr,
                 (uint32_t)(chain->super_VectorView<unsigned_int>).buffer_size,1,&local_f0);
      access_chain_internal_abi_cxx11_
                (&local_70,this,local_134,(chain->super_VectorView<unsigned_int>).ptr,
                 (uint32_t)(chain->super_VectorView<unsigned_int>).buffer_size,1,&local_100);
      uVar4 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,2);
      uVar7 = uVar4 + 1;
      local_130 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)CONCAT71(local_130._1_7_,1);
      local_140 = uVar7;
      local_13c = uVar4;
      pSVar5 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                         (&this->super_Compiler,uVar4,&local_50,&local_114,(bool *)&local_130);
      pSVar5->need_transpose = local_f0.need_transpose;
      if (local_f0.storage_is_packed == true) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar4,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
      if (local_f0.storage_physical_type != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar4,SPIRVCrossDecorationPhysicalTypeID,
                   local_f0.storage_physical_type);
      }
      puVar1 = &(this->super_Compiler).forwarded_temporaries;
      local_130 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)puVar1;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar1,&local_13c);
      puVar2 = &(this->super_Compiler).suppressed_usage_tracking;
      local_130 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)puVar2;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar2,&local_13c);
      local_130 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)CONCAT71(local_130._1_7_,1);
      pSVar5 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                         (&this->super_Compiler,uVar7,&local_70,&local_118,(bool *)&local_130);
      pSVar5->need_transpose = local_100.need_transpose;
      if (local_100.storage_is_packed == true) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar7,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
      if (local_100.storage_physical_type != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar7,SPIRVCrossDecorationPhysicalTypeID,
                   local_100.storage_physical_type);
      }
      local_130 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)puVar1;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar1,&local_140);
      local_130 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)puVar2;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar2,&local_140);
      (*(this->super_Compiler)._vptr_Compiler[0x3f])(this,(ulong)local_13c,(ulong)local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  else {
    uVar4 = to_array_size_literal(this,type,(int)sVar3 - 1);
    SmallVector<unsigned_int,_8UL>::reserve
              (chain,(chain->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar3 = (chain->super_VectorView<unsigned_int>).buffer_size;
    (chain->super_VectorView<unsigned_int>).ptr[sVar3] = 0;
    (chain->super_VectorView<unsigned_int>).buffer_size = sVar3 + 1;
    local_128 = CONCAT44(local_128._4_4_,uVar4);
    if (uVar4 != 0) {
      uVar6 = 0;
      do {
        (chain->super_VectorView<unsigned_int>).ptr
        [(chain->super_VectorView<unsigned_int>).buffer_size - 1] = uVar6;
        uVar4 = (type->parent_type).id;
        uVar7 = (local_108->parent_type).id;
        local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
        local_a8.buffer_capacity = 8;
        local_a8.super_VectorView<unsigned_int>.ptr = (uint *)&local_a8.stack_storage;
        SmallVector<unsigned_int,_8UL>::operator=(&local_a8,chain);
        emit_copy_logical_type(local_120,local_138,uVar4,local_134,uVar7,&local_a8);
        local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_a8.super_VectorView<unsigned_int>.ptr !=
            &local_a8.stack_storage) {
          free(local_a8.super_VectorView<unsigned_int>.ptr);
        }
        uVar6 = uVar6 + 1;
        type = local_110;
      } while ((uint)local_128 != uVar6);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_copy_logical_type(uint32_t lhs_id, uint32_t lhs_type_id, uint32_t rhs_id, uint32_t rhs_type_id,
                                          SmallVector<uint32_t> chain)
{
	// Fully unroll all member/array indices one by one.

	auto &lhs_type = get<SPIRType>(lhs_type_id);
	auto &rhs_type = get<SPIRType>(rhs_type_id);

	if (!lhs_type.array.empty())
	{
		// Could use a loop here to support specialization constants, but it gets rather complicated with nested array types,
		// and this is a rather obscure opcode anyways, keep it simple unless we are forced to.
		uint32_t array_size = to_array_size_literal(lhs_type);
		chain.push_back(0);

		for (uint32_t i = 0; i < array_size; i++)
		{
			chain.back() = i;
			emit_copy_logical_type(lhs_id, lhs_type.parent_type, rhs_id, rhs_type.parent_type, chain);
		}
	}
	else if (lhs_type.basetype == SPIRType::Struct)
	{
		chain.push_back(0);
		uint32_t member_count = uint32_t(lhs_type.member_types.size());
		for (uint32_t i = 0; i < member_count; i++)
		{
			chain.back() = i;
			emit_copy_logical_type(lhs_id, lhs_type.member_types[i], rhs_id, rhs_type.member_types[i], chain);
		}
	}
	else
	{
		// Need to handle unpack/packing fixups since this can differ wildly between the logical types,
		// particularly in MSL.
		// To deal with this, we emit access chains and go through emit_store_statement
		// to deal with all the special cases we can encounter.

		AccessChainMeta lhs_meta, rhs_meta;
		auto lhs = access_chain_internal(lhs_id, chain.data(), uint32_t(chain.size()),
		                                 ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &lhs_meta);
		auto rhs = access_chain_internal(rhs_id, chain.data(), uint32_t(chain.size()),
		                                 ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &rhs_meta);

		uint32_t id = ir.increase_bound_by(2);
		lhs_id = id;
		rhs_id = id + 1;

		{
			auto &lhs_expr = set<SPIRExpression>(lhs_id, std::move(lhs), lhs_type_id, true);
			lhs_expr.need_transpose = lhs_meta.need_transpose;

			if (lhs_meta.storage_is_packed)
				set_extended_decoration(lhs_id, SPIRVCrossDecorationPhysicalTypePacked);
			if (lhs_meta.storage_physical_type != 0)
				set_extended_decoration(lhs_id, SPIRVCrossDecorationPhysicalTypeID, lhs_meta.storage_physical_type);

			forwarded_temporaries.insert(lhs_id);
			suppressed_usage_tracking.insert(lhs_id);
		}

		{
			auto &rhs_expr = set<SPIRExpression>(rhs_id, std::move(rhs), rhs_type_id, true);
			rhs_expr.need_transpose = rhs_meta.need_transpose;

			if (rhs_meta.storage_is_packed)
				set_extended_decoration(rhs_id, SPIRVCrossDecorationPhysicalTypePacked);
			if (rhs_meta.storage_physical_type != 0)
				set_extended_decoration(rhs_id, SPIRVCrossDecorationPhysicalTypeID, rhs_meta.storage_physical_type);

			forwarded_temporaries.insert(rhs_id);
			suppressed_usage_tracking.insert(rhs_id);
		}

		emit_store_statement(lhs_id, rhs_id);
	}
}